

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reuse_async_url_session.hpp
# Opt level: O1

void __thiscall
m2d::savanna::ssl_reuse::
reuse_async_request_executor<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>_>
::run(reuse_async_request_executor<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>_>
      *this,string *host,string *port_str)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  element_type *peVar2;
  fd_set *in_RCX;
  fd_set *in_R8;
  timeval *in_R9;
  size_type *local_e8;
  size_type local_e0;
  size_type local_d8;
  undefined8 uStack_d0;
  size_type *local_c8;
  size_type local_c0;
  size_type local_b8;
  undefined8 uStack_b0;
  message<true,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
  local_a8;
  
  select(this,(int)host,(fd_set *)port_str,in_RCX,in_R8,in_R9);
  peVar2 = (this->logic).
           super___shared_ptr<m2d::savanna::ssl_reuse::interface,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  local_c8 = (size_type *)(host->_M_dataplus)._M_p;
  paVar1 = &host->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8 == paVar1) {
    local_b8 = paVar1->_M_allocated_capacity;
    uStack_b0 = *(undefined8 *)((long)&host->field_2 + 8);
    local_c8 = &local_b8;
  }
  else {
    local_b8 = paVar1->_M_allocated_capacity;
  }
  local_c0 = host->_M_string_length;
  (host->_M_dataplus)._M_p = (pointer)paVar1;
  host->_M_string_length = 0;
  (host->field_2)._M_local_buf[0] = '\0';
  local_e8 = (size_type *)(port_str->_M_dataplus)._M_p;
  paVar1 = &port_str->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8 == paVar1) {
    local_d8 = paVar1->_M_allocated_capacity;
    uStack_d0 = *(undefined8 *)((long)&port_str->field_2 + 8);
    local_e8 = &local_d8;
  }
  else {
    local_d8 = paVar1->_M_allocated_capacity;
  }
  local_e0 = port_str->_M_string_length;
  (port_str->_M_dataplus)._M_p = (pointer)paVar1;
  port_str->_M_string_length = 0;
  (port_str->field_2)._M_local_buf[0] = '\0';
  boost::beast::http::
  message<true,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
  ::message(&local_a8,&this->request_);
  (*peVar2->_vptr_interface[9])(peVar2,&local_c8,&local_e8,&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.
         super_empty_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0U,_false>
         .value_._M_dataplus._M_p !=
      &local_a8.
       super_empty_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0U,_false>
       .value_.field_2) {
    operator_delete(local_a8.
                    super_empty_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0U,_false>
                    .value_._M_dataplus._M_p);
  }
  boost::beast::http::basic_fields<std::allocator<char>_>::~basic_fields
            ((basic_fields<std::allocator<char>_> *)&local_a8);
  if (local_e8 != &local_d8) {
    operator_delete(local_e8);
  }
  if (local_c8 != &local_b8) {
    operator_delete(local_c8);
  }
  return;
}

Assistant:

void run(std::string host, std::string port_str)
		{
			select();
			logic->run(std::move(host), std::move(port_str), request_);
		}